

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

void rotating_example(void)

{
  allocator local_da;
  allocator local_d9;
  string local_d8 [32];
  filename_t local_b8;
  shared_ptr<spdlog::logger> rotating_logger;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  std::__cxx11::string::string((string *)&local_b8,"some_logger_name",&local_d9);
  std::__cxx11::string::string(local_d8,"logs/rotating.txt",&local_da);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88._M_allocated_capacity = 0;
  local_88._8_8_ = 0;
  spdlog::rotating_logger_mt<spdlog::synchronous_factory>
            ((string *)&rotating_logger,&local_b8,(size_t)local_d8,0x500000,true,
             (file_event_handlers *)0x0);
  spdlog::file_event_handlers::~file_event_handlers((file_event_handlers *)&local_88);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rotating_logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void rotating_example() {
    // Create a file rotating logger with 5mb size max and 3 rotated files.
    auto rotating_logger =
        spdlog::rotating_logger_mt("some_logger_name", "logs/rotating.txt", 1048576 * 5, 3);
}